

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O0

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::add_node(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           *this,node_type *n)

{
  bool bVar1;
  reference puVar2;
  reference this_00;
  size_t idx_1;
  size_t idx;
  node_type *n_local;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_local;
  
  bVar1 = boost::container::
          vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
          ::empty((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                   *)&this->overwritable_nodes_);
  if (bVar1) {
    this_local = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                  *)boost::container::
                    vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                    ::size(&this->tree_);
    boost::container::
    vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
    ::push_back(&this->tree_,n);
  }
  else {
    puVar2 = boost::container::
             vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
             ::back((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                     *)&this->overwritable_nodes_);
    this_local = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                  *)*puVar2;
    boost::container::
    vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
    ::pop_back((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                *)&this->overwritable_nodes_);
    this_00 = boost::container::
              vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
              ::at(&this->tree_,(size_type)this_local);
    detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>::operator=(this_00,n);
  }
  return (size_t)this_local;
}

Assistant:

std::size_t add_node(const node_type& n)
    {
        if(overwritable_nodes_.empty())
        {
            const std::size_t idx = tree_.size();
            tree_.push_back(n);
            return idx;
        }
        else
        {
            const std::size_t idx = overwritable_nodes_.back();
            overwritable_nodes_.pop_back();
            tree_.at(idx) = n;
            return idx;
        }
    }